

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int rankResourceImplementationPairs
              (long preferenceFlags,long requirementFlags,PairedList *possibleResources,
              RsrcImplList *possibleResourceImplementations)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong flags2;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  value_type local_48;
  
  std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  sort<bool(*)(std::pair<int,int>const&,std::pair<int,int>const&)>
            ((list<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)possibleResources,
             compareOnFirst);
  p_Var5 = (_List_node_base *)possibleResources;
  while (p_Var5 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)possibleResources) {
    iVar1 = *(int *)((long)&p_Var5[1]._M_next + 4);
    iVar2 = *(int *)&p_Var5[1]._M_next;
    uVar3 = rsrcList->list[iVar1].supportFlags;
    uVar4 = rsrcList->list[iVar1].requiredFlags;
    p_Var6 = (_List_node_base *)implFactory_abi_cxx11_;
    while (p_Var6 = (((_List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)implFactory_abi_cxx11_) {
      flags2 = (**(code **)(*(long *)p_Var6[1]._M_next + 0x10))();
      if (((requirementFlags <= (long)(flags2 & requirementFlags)) &&
          ((long)uVar4 <= (long)(flags2 & uVar4))) &&
         (requirementFlags <= (long)(uVar3 & requirementFlags))) {
        local_48.first = scoreFlags(preferenceFlags,flags2);
        local_48.second.second = (BeagleImplFactory *)p_Var6[1]._M_next;
        local_48.first = local_48.first + iVar2;
        local_48.second.first = iVar1;
        std::__cxx11::
        list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
        ::push_back(possibleResourceImplementations,&local_48);
      }
    }
  }
  std::__cxx11::
  list<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>,std::allocator<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>>>
  ::
  sort<bool(*)(std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&,std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&)>
            ((list<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>,std::allocator<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>>>
              *)possibleResourceImplementations,compareRsrcImpl);
  return 0;
}

Assistant:

int rankResourceImplementationPairs(long preferenceFlags,
                                    long requirementFlags,
                                    PairedList* possibleResources,
                                    RsrcImplList* possibleResourceImplementations) {

    possibleResources->sort(compareOnFirst); // Attempt in rank order, lowest score wins

    // Score each resource-implementation pair given preferences

    for(PairedList::iterator it = possibleResources->begin();
        it != possibleResources->end(); ++it) {
        int resource = (*it).second;
        long resourceRequiredFlags = rsrcList->list[resource].requiredFlags;
        long resourceSupportedFlags = rsrcList->list[resource].supportFlags;
        int resourceScore = (*it).first;
#ifdef BEAGLE_DEBUG_FLOW
        fprintf(stderr,"Possible resource: %s (%d)\n",rsrcList->list[resource].name,resourceScore);
#endif

        for (std::list<beagle::BeagleImplFactory*>::iterator factory =
             implFactory->begin(); factory != implFactory->end(); factory++) {
            long factoryFlags = (*factory)->getFlags();
#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr,"\tExamining implementation: %s\n",(*factory)->getName());
#endif
            if ( ((requirementFlags & factoryFlags) >= requirementFlags) // Factory meets requirementFlags
                && ((resourceRequiredFlags & factoryFlags) >= resourceRequiredFlags) // Factory meets resourceFlags
                && ((requirementFlags & resourceSupportedFlags) >= requirementFlags) // Resource meets requirementFlags
                ) {
                int implementationScore = scoreFlags(preferenceFlags,factoryFlags);
                int totalScore = resourceScore + implementationScore;
#ifdef BEAGLE_DEBUG_FLOW
                fprintf(stderr,"\tPossible implementation: %s (%d)\n",
                        (*factory)->getName(),totalScore);
#endif

                possibleResourceImplementations->push_back(std::make_pair(totalScore, std::make_pair(resource, (*factory))));

            }
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nOriginal list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)\n", factory->getName(), (*it).first);
    }
#endif

    possibleResourceImplementations->sort(compareRsrcImpl);

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nSorted list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)  (%d)\n", factory->getName(), (*it).first, (*it).second.first);
    }
#endif


    return BEAGLE_SUCCESS;
}